

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

char * __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  ostream *poVar4;
  cmake *this_01;
  PolicyID id;
  string sStack_1b8;
  ostringstream e;
  
  if ((this->Policy54Status < NEW) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    this_00 = this->Makefile;
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    pcVar3 = cmMakefile::GetDefinition(this_00,psVar2);
    if (pcVar3 != (char *)0x0) {
      bVar1 = cmExpandedCommandArgument::WasQuoted(argument);
      if (!bVar1) {
        return pcVar3;
      }
      if (this->Policy54Status != WARN) {
        return pcVar3;
      }
      bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext);
      if (bVar1) {
        return pcVar3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1b8,(cmPolicies *)0x36,id);
      poVar4 = std::operator<<((ostream *)&e,(string *)&sStack_1b8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&sStack_1b8);
      poVar4 = std::operator<<((ostream *)&e,"Quoted variables like \"");
      psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar4 = std::operator<<(poVar4,(string *)psVar2);
      std::operator<<(poVar4,
                      "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     );
      this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&sStack_1b8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return nullptr;
  }

  const char* def = this->Makefile.GetDefinition(argument.GetValue());

  if (def && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(
          this->ExecutionContext)) {
      std::ostringstream e;
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)) << "\n";
      e << "Quoted variables like \"" << argument.GetValue()
        << "\" will no longer be dereferenced "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return def;
}